

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall Clasp::UncoreMinimize::pushTrim(UncoreMinimize *this,Solver *s)

{
  bool bVar1;
  uint32 uVar2;
  size_type sVar3;
  weight_t wVar4;
  Solver *this_00;
  Solver *in_RSI;
  Solver *in_RDI;
  Todo *unaff_retaddr;
  Limit *limit;
  uint32 top;
  Solver *in_stack_00000060;
  UncoreMinimize *in_stack_00000068;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  Solver *in_stack_ffffffffffffffc0;
  uint32 uVar5;
  Solver *in_stack_ffffffffffffffd0;
  
  uVar5 = (in_RDI->assign_).reason_.super_type.ebo_.cap;
  Todo::shrinkPush(unaff_retaddr,(UncoreMinimize *)in_RDI,in_RSI);
  uVar2 = Solver::rootLevel(in_RSI);
  (in_RDI->assign_).reason_.super_type.ebo_.cap = uVar2;
  if (((uVar2 == uVar5) || (bVar1 = Solver::hasConflict((Solver *)0x1b32dc), bVar1)) ||
     ((*(uint *)((long)&(in_RDI->assign_).reason_.data_.ebo_.buf + 4) >> 0xc & 0x1f) == 0)) {
    bVar1 = Solver::hasStopConflict(in_stack_ffffffffffffffd0);
    if ((bVar1) &&
       (sVar3 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                          ((LitVec *)&in_RDI->lazyRem_), sVar3 == 2)) {
      wVar4 = Todo::weight((Todo *)&in_RDI->shared_);
      *(long *)&(in_RDI->assign_).trail.ebo_.size =
           *(long *)&(in_RDI->assign_).trail.ebo_.size - (long)wVar4;
      Todo::clear((Todo *)in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
      Solver::clearStopConflict(in_stack_ffffffffffffffc0);
      uVar5 = (uint32)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear
                ((LitVec *)&in_RDI->lazyRem_);
      popPath((UncoreMinimize *)in_stack_ffffffffffffffd0,in_RDI,uVar5);
      pushPath(in_stack_00000068,in_stack_00000060);
    }
  }
  else {
    this_00 = (Solver *)operator_new(0x20);
    pushTrim(Clasp::Solver&)::Limit::Limit(Clasp::UncoreMinimize__unsigned_long_
              ((Limit *)in_stack_ffffffffffffffd0,(UncoreMinimize *)in_RDI,(uint64)this_00);
    uVar5 = (uint32)((ulong)in_RDI >> 0x20);
    Solver::addPost(this_00,(PostPropagator *)
                            CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    Solver::addUndoWatch(in_stack_ffffffffffffffd0,uVar5,(Constraint *)this_00);
  }
  bVar1 = Solver::hasConflict((Solver *)0x1b343b);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool UncoreMinimize::pushTrim(Solver& s) {
	assert(!s.hasConflict() && s.rootLevel() == aTop_ && conflict_.empty());
	uint32 top = aTop_;
	todo_.shrinkPush(*this, s);
	if ((aTop_ = s.rootLevel()) != top && !s.hasConflict() && options_.tLim) {
		struct Limit : public PostPropagator {
			Limit(UncoreMinimize& s, uint64 lim) : self(&s), limit(lim) {}
			uint32 priority() const { return priority_reserved_ufs + 2; }
			bool propagateFixpoint(Clasp::Solver& s, Clasp::PostPropagator* ctx) {
				if (ctx || s.stats.conflicts < limit) { return true; }
				s.setStopConflict();
				self->next_ = 1;
				self = 0;
				s.removePost(this);
				return false;
			}
			void undoLevel(Solver& s) {
				if (self) { s.removePost(this); }
				this->destroy();
			}
			UncoreMinimize* self;
			uint64 limit;
		}*limit = new Limit(*this, s.stats.conflicts + (uint64(1) << options_.tLim));
		s.addPost(limit);
		s.addUndoWatch(aTop_, limit);
	}
	else if (s.hasStopConflict() && conflict_.size() == 2) {
		assert(getData(conflict_[1].rep()).assume);
		lower_ -= todo_.weight();
		todo_.clear(true);
		s.clearStopConflict();
		conflict_.clear();
		popPath(s, 0);
		pushPath(s);
	}
	return !s.hasConflict();
}